

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

int main(void)

{
  T *pTVar1;
  _Head_base<0UL,_i1_*,_false> _Var2;
  i2 *piVar3;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  pointer *__ptr;
  unique_ptr<T,_std::default_delete<T>_> object;
  T *local_28;
  
  pTVar1 = (T *)operator_new(0x18);
  _Var2._M_head_impl = (i1 *)operator_new(8);
  (_Var2._M_head_impl)->_vptr_i1 = (_func_int **)&PTR__i1_00103d88;
  piVar3 = (i2 *)operator_new(8);
  piVar3->_vptr_i2 = (_func_int **)&PTR__i2_00103db0;
  (pTVar1->i1_)._M_t.super___uniq_ptr_impl<i1,_std::default_delete<i1>_>._M_t.
  super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.super__Head_base<0UL,_i1_*,_false>.
  _M_head_impl = _Var2._M_head_impl;
  (pTVar1->i2_)._M_t.super___uniq_ptr_impl<i2,_std::default_delete<i2>_>._M_t.
  super__Tuple_impl<0UL,_i2_*,_std::default_delete<i2>_>.super__Head_base<0UL,_i2_*,_false>.
  _M_head_impl = piVar3;
  pTVar1->i = 0x2a;
  _Var2._M_head_impl =
       (pTVar1->i1_)._M_t.super___uniq_ptr_impl<i1,_std::default_delete<i1>_>._M_t.
       super__Tuple_impl<0UL,_i1_*,_std::default_delete<i1>_>.super__Head_base<0UL,_i1_*,_false>.
       _M_head_impl;
  local_28 = pTVar1;
  if (_Var2._M_head_impl != (i1 *)0x0) {
    lVar4 = __dynamic_cast(_Var2._M_head_impl,&i1::typeinfo,&impl1::typeinfo,0);
    if (lVar4 != 0) {
      piVar3 = (pTVar1->i2_)._M_t.super___uniq_ptr_impl<i2,_std::default_delete<i2>_>._M_t.
               super__Tuple_impl<0UL,_i2_*,_std::default_delete<i2>_>.
               super__Head_base<0UL,_i2_*,_false>._M_head_impl;
      if (piVar3 != (i2 *)0x0) {
        lVar4 = __dynamic_cast(piVar3,&i2::typeinfo,&impl2::typeinfo,0);
        if (lVar4 != 0) {
          plVar5 = (long *)operator_new(8);
          *plVar5 = (long)&PTR__i1_00103d88;
          lVar4 = __dynamic_cast(plVar5,&i1::typeinfo,&impl1::typeinfo,0);
          if (lVar4 == 0) {
            __assert_fail("dynamic_cast<impl1*>(up1.get())",
                          "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module.cpp"
                          ,0x3c,"int main()");
          }
          puVar6 = (undefined8 *)operator_new(8);
          *puVar6 = &PTR__i2_00103db0;
          lVar4 = __dynamic_cast(puVar6,&i2::typeinfo,&impl2::typeinfo,0);
          if (lVar4 != 0) {
            operator_delete(puVar6,8);
            (**(code **)(*plVar5 + 8))(plVar5);
            if (local_28 != (T *)0x0) {
              std::default_delete<T>::operator()((default_delete<T> *)&local_28,local_28);
            }
            return 0;
          }
          __assert_fail("dynamic_cast<impl2*>(up2.get())",
                        "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module.cpp"
                        ,0x3e,"int main()");
        }
      }
      __assert_fail("dynamic_cast<impl2*>(object->i2_.get())",
                    "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module.cpp"
                    ,0x39,"int main()");
    }
  }
  __assert_fail("dynamic_cast<impl1*>(object->i1_.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/module.cpp"
                ,0x38,"int main()");
}

Assistant:

int main() {
  auto injector = di::make_injector(module1(), module2());
  auto object = injector.create<std::unique_ptr<T>>();
  assert(dynamic_cast<impl1*>(object->i1_.get()));
  assert(dynamic_cast<impl2*>(object->i2_.get()));
  assert(42 == object->i);
  auto up1 = injector.create<std::unique_ptr<i1>>();
  assert(dynamic_cast<impl1*>(up1.get()));
  auto up2 = injector.create<std::unique_ptr<i2>>();
  assert(dynamic_cast<impl2*>(up2.get()));
}